

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNShaperTest.cpp
# Opt level: O3

int testUpwardPass(void)

{
  pointer pcVar1;
  bool bVar2;
  ModelDescription *pMVar3;
  Type *pTVar4;
  FeatureType *pFVar5;
  Type *pTVar6;
  ArrayFeatureType_EnumeratedShapes *pAVar7;
  ArrayFeatureType *pAVar8;
  TypeUnion this;
  Type *pTVar9;
  ValidPadding *this_00;
  WeightParams *pWVar10;
  LayerUnion LVar11;
  ShapeConstraint *this_01;
  ShapeRange *pSVar12;
  size_t sVar13;
  ostream *poVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_02;
  RangeValue RVar18;
  Model m1;
  NeuralNetworkShaper shapes;
  string local_e0;
  Model local_c0;
  undefined1 local_90 [56];
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  local_58;
  
  CoreML::Specification::Model::Model(&local_c0);
  if (local_c0.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_c0.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_c0.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_90 + 0x10;
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] == 5) {
    pAVar8 = (pFVar5->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  if (pAVar8->_oneof_case_[0] == 0x1f) {
    pAVar7 = (pAVar8->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar8);
    pAVar8->_oneof_case_[0] = 0x1f;
    pAVar7 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar7);
    (pAVar8->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar7;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar7->shapes_,(Type *)0x0);
  pTVar6->lowerbound_ = 4;
  pTVar6->upperbound_ = 4;
  if (pAVar8->_oneof_case_[0] == 0x1f) {
    pAVar7 = (pAVar8->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar8);
    pAVar8->_oneof_case_[0] = 0x1f;
    pAVar7 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar7);
    (pAVar8->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar7;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar7->shapes_,(Type *)0x0);
  pTVar6->lowerbound_ = 1;
  pTVar6->upperbound_ = 1;
  if (pAVar8->_oneof_case_[0] == 0x1f) {
    pAVar7 = (pAVar8->ShapeFlexibility_).enumeratedshapes_;
  }
  else {
    CoreML::Specification::ArrayFeatureType::clear_ShapeFlexibility(pAVar8);
    pAVar8->_oneof_case_[0] = 0x1f;
    pAVar7 = (ArrayFeatureType_EnumeratedShapes *)operator_new(0x30);
    CoreML::Specification::ArrayFeatureType_ShapeRange::ArrayFeatureType_ShapeRange
              ((ArrayFeatureType_ShapeRange *)pAVar7);
    (pAVar8->ShapeFlexibility_).shaperange_ = (ArrayFeatureType_ShapeRange *)pAVar7;
  }
  pTVar6 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                     ((RepeatedPtrFieldBase *)&pAVar7->shapes_,(Type *)0x0);
  pTVar6->lowerbound_ = 1;
  pTVar6->upperbound_ = -1;
  if (local_c0.description_ == (ModelDescription *)0x0) {
    pMVar3 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar3);
    local_c0.description_ = pMVar3;
  }
  pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_c0.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_90._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar4->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_90);
  if ((pointer)local_90._0_8_ != pcVar1) {
    operator_delete((void *)local_90._0_8_,local_90._16_8_ + 1);
  }
  pFVar5 = pTVar4->type_;
  if (pFVar5 == (FeatureType *)0x0) {
    pFVar5 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar5);
    pTVar4->type_ = pFVar5;
  }
  if (pFVar5->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar5);
    pFVar5->_oneof_case_[0] = 5;
    pAVar8 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar8);
    (pFVar5->Type_).multiarraytype_ = pAVar8;
  }
  if (local_c0._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_c0);
    local_c0._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_c0.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_02 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_c0.Type_.pipeline_)->models_;
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)this_02,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar9,"input");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar9,"conv_out");
  if (pTVar9->_oneof_case_[0] == 100) {
    LVar11 = pTVar9->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar9);
    pTVar9->_oneof_case_[0] = 100;
    LVar11.convolution_ = (ConvolutionLayerParams *)operator_new(0xb0);
    CoreML::Specification::ConvolutionLayerParams::ConvolutionLayerParams(LVar11.convolution_);
    (pTVar9->layer_).convolution_ = (ConvolutionLayerParams *)LVar11;
  }
  (LVar11.convolution_)->outputchannels_ = 5;
  (LVar11.convolution_)->kernelchannels_ = 4;
  iVar17 = ((LVar11.convolution_)->kernelsize_).current_size_;
  iVar15 = ((LVar11.convolution_)->kernelsize_).total_size_;
  if (iVar17 == iVar15) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&(LVar11.convolution_)->kernelsize_,iVar17 + 1);
    iVar17 = ((LVar11.convolution_)->kernelsize_).current_size_;
    iVar15 = ((LVar11.convolution_)->kernelsize_).total_size_;
  }
  pWVar10 = (LVar11.innerproduct_)->bias_;
  iVar16 = iVar17 + 1;
  ((LVar11.convolution_)->kernelsize_).current_size_ = iVar16;
  (&pWVar10->_internal_metadata_)[iVar17].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x1;
  if (iVar16 == iVar15) {
    google::protobuf::RepeatedField<unsigned_long>::Reserve
              (&(LVar11.convolution_)->kernelsize_,iVar17 + 2);
    iVar16 = ((LVar11.convolution_)->kernelsize_).current_size_;
    pWVar10 = (LVar11.innerproduct_)->bias_;
  }
  ((LVar11.convolution_)->kernelsize_).current_size_ = iVar16 + 1;
  (&pWVar10->_internal_metadata_)[iVar16].
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0xa;
  if ((LVar11.convolution_)->_oneof_case_[0] != 0x32) {
    CoreML::Specification::ConvolutionLayerParams::clear_ConvolutionPaddingType(LVar11.convolution_)
    ;
    (LVar11.convolution_)->_oneof_case_[0] = 0x32;
    this_00 = (ValidPadding *)operator_new(0x20);
    CoreML::Specification::ValidPadding::ValidPadding(this_00);
    ((LVar11.convolution_)->ConvolutionPaddingType_).valid_ = this_00;
  }
  (LVar11.convolution_)->hasbias_ = false;
  iVar17 = 200;
  do {
    pWVar10 = (LVar11.convolution_)->weights_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar10);
      (LVar11.convolution_)->weights_ = pWVar10;
    }
    iVar15 = (pWVar10->floatvalue_).current_size_;
    if (iVar15 == (pWVar10->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar15 + 1);
      iVar15 = (pWVar10->floatvalue_).current_size_;
    }
    (pWVar10->floatvalue_).current_size_ = iVar15 + 1;
    ((pWVar10->floatvalue_).rep_)->elements[iVar15] = 1.0;
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  pTVar9 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                     ((RepeatedPtrFieldBase *)this_02,(Type *)0x0);
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar9,"conv_out");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar9,"output");
  if (pTVar9->_oneof_case_[0] == 0x8c) {
    LVar11 = pTVar9->layer_;
  }
  else {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar9);
    pTVar9->_oneof_case_[0] = 0x8c;
    LVar11.convolution_ = (ConvolutionLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(LVar11.innerproduct_);
    (pTVar9->layer_).innerproduct_ = (InnerProductLayerParams *)LVar11;
  }
  (LVar11.innerproduct_)->inputchannels_ = 5;
  (LVar11.innerproduct_)->outputchannels_ = 1;
  (LVar11.innerproduct_)->hasbias_ = false;
  iVar17 = 5;
  do {
    pWVar10 = (WeightParams *)((LVar11.activation_)->NonlinearityType_).relu_;
    if (pWVar10 == (WeightParams *)0x0) {
      pWVar10 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar10);
      ((LVar11.activation_)->NonlinearityType_).relu_ = (ActivationReLU *)pWVar10;
    }
    iVar15 = (pWVar10->floatvalue_).current_size_;
    if (iVar15 == (pWVar10->floatvalue_).total_size_) {
      google::protobuf::RepeatedField<float>::Reserve(&pWVar10->floatvalue_,iVar15 + 1);
      iVar15 = (pWVar10->floatvalue_).current_size_;
    }
    (pWVar10->floatvalue_).current_size_ = iVar15 + 1;
    ((pWVar10->floatvalue_).rep_)->elements[iVar15] = 1.0;
    iVar17 = iVar17 + -1;
  } while (iVar17 != 0);
  CoreML::NeuralNetworkShaper::NeuralNetworkShaper((NeuralNetworkShaper *)local_90,&local_c0,true);
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"input","");
  this_01 = CoreML::NeuralNetworkShaper::shape((NeuralNetworkShaper *)local_90,&local_e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
    operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
  }
  pSVar12 = CoreML::ShapeConstraint::sequenceRange(this_01);
  sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
  if (sVar13 == 0) {
    pSVar12 = CoreML::ShapeConstraint::sequenceRange(this_01);
    RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
    local_e0._M_string_length = RVar18._val;
    local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
    bVar2 = CoreML::RangeValue::isUnbound((RangeValue *)&local_e0);
    if (bVar2) {
      pSVar12 = CoreML::ShapeConstraint::batchRange(this_01);
      sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
      if (sVar13 == 0) {
        pSVar12 = CoreML::ShapeConstraint::batchRange(this_01);
        RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
        local_e0._M_string_length = RVar18._val;
        local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
        bVar2 = CoreML::RangeValue::isUnbound((RangeValue *)&local_e0);
        if (bVar2) {
          pSVar12 = CoreML::ShapeConstraint::channelRange(this_01);
          sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
          if (sVar13 == 4) {
            pSVar12 = CoreML::ShapeConstraint::channelRange(this_01);
            RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
            local_e0._M_string_length = RVar18._val;
            local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
            sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
            if (sVar13 == 4) {
              pSVar12 = CoreML::ShapeConstraint::heightRange(this_01);
              sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
              if (sVar13 == 1) {
                pSVar12 = CoreML::ShapeConstraint::heightRange(this_01);
                RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                local_e0._M_string_length = RVar18._val;
                local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
                if (sVar13 == 1) {
                  pSVar12 = CoreML::ShapeConstraint::widthRange(this_01);
                  sVar13 = CoreML::ShapeRange::minimumValue(pSVar12);
                  if (sVar13 == 10) {
                    pSVar12 = CoreML::ShapeConstraint::widthRange(this_01);
                    RVar18 = CoreML::ShapeRange::maximumValue(pSVar12);
                    local_e0._M_string_length = RVar18._val;
                    local_e0._M_dataplus._M_p._0_1_ = RVar18._isUnbound;
                    sVar13 = CoreML::RangeValue::value((RangeValue *)&local_e0);
                    iVar17 = 0;
                    if (sVar13 == 10) goto LAB_0014f2da;
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               ,0x68);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14d);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"inShape.widthRange().maximumValue().value() == 10",0x31);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14," was false, expected true.",0x1a);
                  }
                  else {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                               ,0x68);
                    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14c);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14,"inShape.widthRange().minimumValue() == 10",0x29);
                    std::__ostream_insert<char,std::char_traits<char>>
                              (poVar14," was false, expected true.",0x1a);
                  }
                }
                else {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                             ,0x68);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x14a);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14,"inShape.heightRange().maximumValue().value() == 1",0x31);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14," was false, expected true.",0x1a);
                }
              }
              else {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                           ,0x68);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x149);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14,"inShape.heightRange().minimumValue() == 1",0x29);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar14," was false, expected true.",0x1a);
              }
            }
            else {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                         ,0x68);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x147);
              std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14,"inShape.channelRange().maximumValue().value() == 4",0x32);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar14," was false, expected true.",0x1a);
            }
          }
          else {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                       ,0x68);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x146);
            std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14,"inShape.channelRange().minimumValue() == 4",0x2a);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14," was false, expected true.",0x1a);
          }
          iVar17 = 1;
          std::endl<char,std::char_traits<char>>(poVar14);
          goto LAB_0014f2da;
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x144);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"inShape.batchRange().maximumValue().isUnbound()",0x2f);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x143);
        std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14,"inShape.batchRange().minimumValue() == 0",0x28);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar14," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
                 ,0x68);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
      poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x141);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar14,"inShape.sequenceRange().maximumValue().isUnbound()",0x32);
      std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNShaperTest.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x140);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar14,"inShape.sequenceRange().minimumValue() == 0",0x2b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar14 + -0x18) + (char)poVar14);
  }
  std::ostream::put((char)poVar14);
  iVar17 = 1;
  std::ostream::flush();
LAB_0014f2da:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
  ::~_Rb_tree(&local_58);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               *)(local_90 + 8));
  CoreML::Specification::Model::~Model(&local_c0);
  return iVar17;
}

Assistant:

int testUpwardPass() {
    
    Specification::Model m1;
    
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    auto *shape1 = shape->mutable_shaperange()->add_sizeranges();
    shape1->set_lowerbound(4);
    shape1->set_upperbound(4);
    auto *shape2 = shape->mutable_shaperange()->add_sizeranges();
    shape2->set_lowerbound(1);
    shape2->set_upperbound(1);
    auto *shape3 = shape->mutable_shaperange()->add_sizeranges();
    shape3->set_lowerbound(1);
    shape3->set_upperbound(-1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();
    
    auto *nn = m1.mutable_neuralnetwork();
    
    Specification::NeuralNetworkLayer *convLayer = nn->add_layers();
    convLayer->add_input("input");
    convLayer->add_output("conv_out");
    Specification::ConvolutionLayerParams *convParams = convLayer->mutable_convolution();
    convParams->set_outputchannels(5);
    convParams->set_kernelchannels(4);
    convParams->add_kernelsize(1);
    convParams->add_kernelsize(10);
    convParams->mutable_valid();
    convParams->set_hasbias(false);
    for (int i = 0; i < 5*4*10; i++) {
        convParams->mutable_weights()->add_floatvalue(1.0);
    }
    
    Specification::NeuralNetworkLayer *ipLayer = nn->add_layers();
    ipLayer->add_input("conv_out");
    ipLayer->add_output("output");
    Specification::InnerProductLayerParams *ipParams = ipLayer->mutable_innerproduct();
    ipParams->set_inputchannels(5);
    ipParams->set_outputchannels(1);
    ipParams->set_hasbias(false);
    for (int i = 0; i < 5; i++) {
        ipParams->mutable_weights()->add_floatvalue(1.0);
    }

    NeuralNetworkShaper shapes(m1);
    
    const ShapeConstraint &inShape = shapes.shape("input");
    ML_ASSERT(inShape.sequenceRange().minimumValue() == 0);
    ML_ASSERT(inShape.sequenceRange().maximumValue().isUnbound());
    
    ML_ASSERT(inShape.batchRange().minimumValue() == 0);
    ML_ASSERT(inShape.batchRange().maximumValue().isUnbound());

    ML_ASSERT(inShape.channelRange().minimumValue() == 4);
    ML_ASSERT(inShape.channelRange().maximumValue().value() == 4);
    
    ML_ASSERT(inShape.heightRange().minimumValue() == 1);
    ML_ASSERT(inShape.heightRange().maximumValue().value() == 1);

    ML_ASSERT(inShape.widthRange().minimumValue() == 10);
    ML_ASSERT(inShape.widthRange().maximumValue().value() == 10);
    
    return 0;
    
}